

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_ptr.hpp
# Opt level: O2

void __thiscall
boost::shared_ptr<BayesianGameIdenticalPayoffSolver>::
shared_ptr<BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>>
          (shared_ptr<BayesianGameIdenticalPayoffSolver> *this,
          BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG> *p)

{
  this->px = (element_type *)p;
  (this->pn).pi_ = (sp_counted_base *)0x0;
  detail::
  sp_pointer_construct<BayesianGameIdenticalPayoffSolver,BGIP_IncrementalSolverInterface_T<JointPolicyPureVectorForClusteredBG>>
            (this,p,&this->pn);
  return;
}

Assistant:

explicit shared_ptr( Y * p ): px( p ), pn() // Y must be complete
    {
        boost::detail::sp_pointer_construct( this, p, pn );
    }